

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardCase::createInstance(ShaderDiscardCase *this,Context *context)

{
  deInt32 *pdVar1;
  bool bVar2;
  ShaderRenderCaseInstance *this_00;
  TextureBinding *this_01;
  SharedPtr<vkt::sr::TextureBinding> brickTexture;
  Sampler local_68;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x210);
  bVar2 = this->m_usesTexture;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,(this->super_ShaderRenderCase).m_isVertexCase,
             (this->super_ShaderRenderCase).m_evaluator.
             super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
             .m_data.ptr,
             (this->super_ShaderRenderCase).m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,(AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d2c0f0;
  if (bVar2 != false) {
    this_01 = (TextureBinding *)operator_new(0x68);
    local_68.wrapS = CLAMP_TO_EDGE;
    local_68.wrapT = CLAMP_TO_EDGE;
    local_68.wrapR = CLAMP_TO_EDGE;
    local_68.minFilter = LINEAR;
    local_68.magFilter = LINEAR;
    local_68.lodThreshold = 0.0;
    local_68.normalizedCoords = true;
    local_68.depthStencilMode = MODE_DEPTH;
    local_68.compare = COMPAREMODE_NONE;
    local_68.compareChannel = 0;
    local_68.borderColor.v.uData[0]._0_1_ = 0;
    local_68.borderColor.v._1_7_ = 0;
    local_68.borderColor.v.uData[2]._0_1_ = 0;
    local_68._45_8_ = 0;
    TextureBinding::TextureBinding
              (this_01,((this_00->super_TestInstance).m_context)->m_testCtx->m_curArchive,
               "vulkan/data/brick.png",TYPE_2D,&local_68);
    brickTexture.m_state = (SharedPtrStateBase *)0x0;
    brickTexture.m_ptr = this_01;
    brickTexture.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (brickTexture.m_state)->strongRefCount = 0;
    (brickTexture.m_state)->weakRefCount = 0;
    (brickTexture.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d2bfc0;
    brickTexture.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
    (brickTexture.m_state)->strongRefCount = 1;
    (brickTexture.m_state)->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
    ::push_back(&this_00->m_textures,&brickTexture);
    if (brickTexture.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(brickTexture.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        brickTexture.m_ptr = (TextureBinding *)0x0;
        (*(brickTexture.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(brickTexture.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (brickTexture.m_state != (SharedPtrStateBase *)0x0)) {
        (*(brickTexture.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*	createInstance				(Context& context) const
							{
								DE_ASSERT(m_evaluator != DE_NULL);
								DE_ASSERT(m_uniformSetup != DE_NULL);
								return new ShaderDiscardCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_usesTexture);
							}